

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O3

_Bool bitset_contains_all(bitset_t *b1,bitset_t *b2)

{
  uint64_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  _Bool _Var6;
  
  uVar4 = b1->arraysize;
  uVar2 = b2->arraysize;
  uVar3 = uVar2;
  if (uVar4 < uVar2) {
    uVar3 = uVar4;
  }
  if (uVar3 != 0) {
    uVar5 = 0;
    do {
      if ((b2->array[uVar5] & ~b1->array[uVar5]) != 0) {
        return false;
      }
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  _Var6 = true;
  if (uVar4 < uVar2) {
    do {
      puVar1 = b2->array + uVar4;
      _Var6 = *puVar1 == 0;
      if (uVar2 - 1 == uVar4) {
        return _Var6;
      }
      uVar4 = uVar4 + 1;
    } while (*puVar1 == 0);
  }
  return _Var6;
}

Assistant:

bool bitset_contains_all(const bitset_t *CBITSET_RESTRICT b1,
                         const bitset_t *CBITSET_RESTRICT b2) {
    size_t min_size = b1->arraysize;
    if (b1->arraysize > b2->arraysize) {
        min_size = b2->arraysize;
    }
    for (size_t k = 0; k < min_size; k++) {
        if ((b1->array[k] & b2->array[k]) != b2->array[k]) {
            return false;
        }
    }
    if (b2->arraysize > b1->arraysize) {
        /* Need to check if b2 has any bits set beyond b1's array */
        return !any_bits_set(b2, b1->arraysize);
    }
    return true;
}